

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 reindex(dtree_node_t *node,uint32 *next_id)

{
  uint32 uVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    uVar1 = *next_id;
    *next_id = uVar1 + 1;
    node->node_id = uVar1;
    if ((node->y == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) break;
    uVar1 = reindex(node->y,next_id);
    node = node->n;
    iVar2 = iVar2 + uVar1 + 1;
  }
  return iVar2 + 1;
}

Assistant:

uint32
reindex(dtree_node_t *node,
	uint32 *next_id)
{
    node->node_id = (*next_id)++;

    if (!IS_LEAF(node)) {
	return reindex(node->y, next_id) +
	    reindex(node->n, next_id) + 1;
    }
    else {
	return 1;
    }
}